

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall
CTcGenTarg::close_method
          (CTcGenTarg *this,int param_1,CTcPrsSymtab *param_2,CTcTokFileDesc *end_desc,
          long end_linenum,tct3_method_gen_ctx *ctx,CTcNamedArgTab *named_arg_tab_head)

{
  CTcGenTarg *this_00;
  uchar opc;
  int iVar1;
  CTcGenTarg *this_01;
  CTcPrsSymtab *t;
  CTcNamedArgTab *nt;
  
  this_00 = (CTcGenTarg *)ctx->stream;
  iVar1 = can_skip_op(this);
  if (iVar1 == 0) {
    add_line_rec(this,end_desc,end_linenum);
    opc = 'Q';
    if ((this->field_0xd0 & 1) != 0) {
      write_op(this,0x84);
      opc = 'P';
    }
    write_op(this,opc);
  }
  for (; named_arg_tab_head != (CTcNamedArgTab *)0x0; named_arg_tab_head = named_arg_tab_head->nxt)
  {
    CTcNamedArgTab::generate(named_arg_tab_head);
  }
  this_01 = this_00;
  CTcCodeStream::release_labels((CTcCodeStream *)this_00);
  if (G_tcmain->error_count_ == 0) {
    remove_jumps_to_jumps(this_01,(CTcCodeStream *)this_00,ctx->code_start_ofs);
  }
  ctx->code_end_ofs = this_00->max_str_len_;
  CTcDataStream::write2_at((CTcDataStream *)this_00,ctx->method_ofs + 2,param_1);
  CTcDataStream::write2_at
            ((CTcDataStream *)this_00,ctx->method_ofs + 4,param_1 + this->max_sp_depth_);
  for (; param_2 != (CTcPrsSymtab *)0x0; param_2 = param_2->parent_) {
    CTcPrsSymtab::add_to_range(param_2,(int)(G_cs->super_CTcDataStream).ofs_ - (int)ctx->method_ofs)
    ;
  }
  if ((this->exc_table_).exc_used_ != 0) {
    CTcDataStream::write2_at
              ((CTcDataStream *)this_00,ctx->method_ofs + 6,
               (int)this_00->max_str_len_ - (int)ctx->method_ofs);
    CTcT3ExcTable::write_to_code_stream(&this->exc_table_);
    return;
  }
  return;
}

Assistant:

void CTcGenTarg::close_method(int local_cnt,
                              CTcPrsSymtab *local_symtab,
                              CTcTokFileDesc *end_desc, long end_linenum,
                              tct3_method_gen_ctx *ctx,
                              CTcNamedArgTab *named_arg_tab_head)
{
    /* get the output code stream from the context */
    CTcCodeStream *stream = ctx->stream;
    
    /* 
     *   Generate a 'return' opcode with a default 'nil' return value - this
     *   will ensure that code that reaches the end of the procedure returns
     *   normally.  If this is a constructor, return the 'self' object rather
     *   than nil.
     *   
     *   We only need to generate this epilogue if the next instruction would
     *   be reachable.  If it's not reachable, then the code explicitly took
     *   care of all types of exits.  
     */
    if (!can_skip_op())
    {
        /* 
         *   add a line record for the implied return at the last source line
         *   of the code body 
         */
        add_line_rec(end_desc, end_linenum);

        /* write the appropriate return */
        if (is_in_constructor())
        {
            /* we're in a constructor - return 'self' */
            write_op(OPC_PUSHSELF);
            write_op(OPC_RETVAL);
        }
        else
        {
            /* 
             *   Normal method/function - return without a value (explicitly
             *   set R0 to nil, though, so we don't return something returned
             *   from a called function).  
             */
            write_op(OPC_RETNIL);
        }
    }

    /* generate any named argument tables */
    for (CTcNamedArgTab *nt = named_arg_tab_head ; nt != 0 ; nt = nt->nxt)
        nt->generate();

    /* 
     *   release labels allocated for the code block; this will log an error
     *   if any labels are undefined 
     */
    stream->release_labels();

    /* 
     *   Eliminate jump-to-jump sequences in the generated code.  Don't
     *   bother if we've found any errors, as the generated code will not
     *   necessarily be valid if this is the case.  
     */
    if (G_tcmain->get_error_count() == 0)
        remove_jumps_to_jumps(stream, ctx->code_start_ofs);

    /* note the code block's end point */
    ctx->code_end_ofs = stream->get_ofs();

    /*
     *   Fix up the local variable count in the function header.  We might
     *   allocate extra locals for internal use while generating code, so we
     *   must wait until after generating our code before we know the final
     *   local count.  
     */
    stream->write2_at(ctx->method_ofs + 2, local_cnt);

    /* 
     *   Fix up the total stack space indicator in the function header.  The
     *   total stack size must include the locals, as well as stack space
     *   needed for intermediate computations.  
     */
    stream->write2_at(ctx->method_ofs + 4, get_max_sp_depth() + local_cnt);

    /*
     *   Before writing the exception table, mark the endpoint of the range
     *   of the main local scope and any enclosing scopes.  
     */
    for (CTcPrsSymtab *t = local_symtab ; t != 0 ; t = t->get_parent())
        t->add_to_range(G_cs->get_ofs() - ctx->method_ofs);

    /* 
     *   Generate the exception table, if we have one.  If we have no
     *   exception records, leave the exception table offset set to zero to
     *   indicate that there is no exception table for the method.  
     */
    if (get_exc_table()->get_entry_count() != 0)
    {
        /* 
         *   write the exception table offset - it's at the current offset in
         *   the code 
         */
        stream->write2_at(ctx->method_ofs + 6,
                          stream->get_ofs() - ctx->method_ofs);

        /* write the table */
        get_exc_table()->write_to_code_stream();
    }
}